

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskq.c
# Opt level: O0

_Bool nni_taskq_drain(nni_taskq *tq)

{
  int iVar1;
  _Bool local_11;
  _Bool result;
  nni_taskq *tq_local;
  
  local_11 = false;
  nni_mtx_lock(&tq->tq_mtx);
  while( true ) {
    iVar1 = nni_list_empty(&tq->tq_tasks);
    if (iVar1 != 0) break;
    local_11 = true;
    nni_cv_wait(&tq->tq_wait_cv);
  }
  nni_mtx_unlock(&tq->tq_mtx);
  return local_11;
}

Assistant:

bool
nni_taskq_drain(nni_taskq *tq)
{
	bool result = false;
	nni_mtx_lock(&tq->tq_mtx);
	while (!nni_list_empty(&tq->tq_tasks)) {
		result = true;
		nni_cv_wait(&tq->tq_wait_cv);
	}
	nni_mtx_unlock(&tq->tq_mtx);
	return (result);
}